

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<AssignStatementAstNode>_> * __thiscall
Parser::parseAssignStatement
          (optional<std::shared_ptr<AssignStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TokenType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_a0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ostream *local_80;
  size_type __dnew_2;
  shared_ptr<Token> identifier;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_48 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  bool error;
  
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ = 0;
  local_48 = (undefined1  [8])0x15;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_58;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::string::_M_create
                 ((ulong *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ulong)local_48);
  local_58._vptr__Sp_counted_base = (_func_int **)local_48;
  (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)0x6465746365707845;
  *(undefined8 *)
   &(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0x746e656469206120;
  *(undefined8 *)
   ((long)&(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_weak_count + 1) = 0x7265696669746e65;
  *(undefined1 *)
   ((long)&(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + (long)local_48) = 0;
  type = (TokenType)this;
  expect((Parser *)&__dnew_2,type,(bool *)0x18,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_58) {
    operator_delete(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(ulong)((long)&((AstNode *)local_58._vptr__Sp_counted_base)->_vptr_AstNode
                                 + 1));
  }
  skipWhiteSpace(this);
  local_48 = (undefined1  [8])0x2c;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_58;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::string::_M_create
                 ((ulong *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ulong)local_48);
  local_58._vptr__Sp_counted_base = (_func_int **)local_48;
  *(undefined8 *)
   &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_weak_count = 0x6365642072617620;
  builtin_strncpy((char *)((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4),"laration",8);
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x6f6c6c6f6620736c;
  *(undefined8 *)
   &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = 0x72617620676e6977;
  (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)0x6465746365707845;
  *(undefined8 *)
   &(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0x61757165206e6120;
  *(undefined1 *)
   ((long)&(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + (long)local_48) = 0;
  expect((Parser *)local_a0,type,(bool *)0x12,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_58) {
    operator_delete(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(ulong)((long)&((AstNode *)local_58._vptr__Sp_counted_base)->_vptr_AstNode
                                 + 1));
  }
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_48,this);
  local_80 = (ostream *)0x3c;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_58;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::string::_M_create
                 ((ulong *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ulong)&local_80);
  local_58._vptr__Sp_counted_base = (_func_int **)local_80;
  *(undefined8 *)
   &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_weak_count = 0x6365642072617620;
  builtin_strncpy((char *)((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi[3]._vptr__Sp_counted_base + 4),"laration",8);
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x6f69737365727078;
  *(undefined8 *)
   &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0x72617620666f206e;
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x6c6f66206e6f6c6f;
  *(undefined8 *)
   &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = 0x6520676e69776f6c;
  (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)0x6465746365707845;
  *(undefined8 *)
   &(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0x63696d6573206120;
  local_80[(long)&(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base] = (ostream)0x0;
  expect((Parser *)(local_a0 + 0x10),type,(bool *)0x10,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_58) {
    operator_delete(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(ulong)((long)local_58._vptr__Sp_counted_base + 1));
  }
  bVar1 = false;
  if ((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ == '\0') &&
     (bVar1 = false, __dnew_2 != 0)) {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ =
         expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ ^ 1;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01'
       ) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fda8;
      __gnu_cxx::new_allocator<AssignStatementAstNode>::
      construct<AssignStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                ((new_allocator<AssignStatementAstNode> *)
                 &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (AssignStatementAstNode *)(p_Var2 + 1),(shared_ptr<Token> *)&__dnew_2,
                 (shared_ptr<ExpressionAstNode> *)local_48);
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (AssignStatementAstNode *)(p_Var2 + 1);
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_engaged = bVar1;
  if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
  {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<AssignStatementAstNode>>
Parser::parseAssignStatement() noexcept {
  bool error = false;

  auto identifier = this->expect(TokenType::Identifier, error, "Expected a identifier");

  this->skipWhiteSpace();

  this->expect(TokenType::Assign, error, "Expected an equals following var declaration");

  auto expression = this->parseExpression();

  this->expect(TokenType::SemiColon, error,
    "Expected a semicolon following expression of var declaration");

  error = error || !identifier || !expression;

  if (error) { return std::nullopt; }

  return std::make_shared<AssignStatementAstNode>(identifier, expression.value());
}